

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O1

NormalizerSpec * __thiscall
sentencepiece::SentencePieceTrainer::GetNormalizerSpec
          (NormalizerSpec *__return_storage_ptr__,SentencePieceTrainer *this,string_view name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *output;
  char *pcVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  void *pvVar5;
  string_view name_00;
  Status _status;
  Die local_49;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> local_48;
  string local_40;
  
  NormalizerSpec::NormalizerSpec(__return_storage_ptr__,(Arena *)0x0);
  *(byte *)(__return_storage_ptr__->_has_bits_).has_bits_ =
       (byte)(__return_storage_ptr__->_has_bits_).has_bits_[0] | 1;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,name._M_len,this + name._M_len);
  pvVar5 = (__return_storage_ptr__->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set(&__return_storage_ptr__->name_,&local_40,pvVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pvVar5 = (__return_storage_ptr__->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)
           ((ulong)(__return_storage_ptr__->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  output = (string *)*puVar3;
  pcVar2 = (char *)puVar3[1];
  (__return_storage_ptr__->_has_bits_).has_bits_[0] =
       (__return_storage_ptr__->_has_bits_).has_bits_[0] | 2;
  if (((ulong)pvVar5 & 1) != 0) {
    pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
            (&__return_storage_ptr__->precompiled_charsmap_,pvVar5);
  name_00._M_str = pcVar2;
  name_00._M_len = (size_t)&local_48;
  normalizer::Builder::GetPrecompiledCharsMap(name_00,output);
  if (local_48._M_head_impl != (Rep *)0x0) {
    local_49.die_ = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"sentencepiece_trainer.cc",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,0x60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_status.ok()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
    util::Status::ToString_abi_cxx11_(&local_40,(Status *)&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    error::Die::~Die(&local_49);
  }
  util::Status::~Status((Status *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

NormalizerSpec SentencePieceTrainer::GetNormalizerSpec(absl::string_view name) {
  NormalizerSpec spec;
  spec.set_name(name.data(), name.size());
  CHECK_OK(normalizer::Builder::GetPrecompiledCharsMap(
      spec.name(), spec.mutable_precompiled_charsmap()));
  return spec;
}